

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O3

void __thiscall
soul::SanityCheckPass::PostResolutionChecks::visit(PostResolutionChecks *this,LoopStatement *loop)

{
  Expression *pEVar1;
  int64_t iVar2;
  pool_ptr<soul::AST::Constant> c;
  Type *local_68;
  uint8_t *local_60;
  StructurePtr SStack_58;
  long local_50;
  CompileMessage local_48;
  
  ASTVisitor::visit(&this->super_ASTVisitor,loop);
  pEVar1 = (loop->numIterations).object;
  if (pEVar1 != (Expression *)0x0) {
    (*(pEVar1->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&local_50);
    if (local_50 != 0) {
      soul::Value::getData((PackedData *)&local_68,(Value *)(local_50 + 0x30));
      iVar2 = soul::Value::PackedData::getAsInt64((PackedData *)&local_68);
      if (iVar2 < 1) {
        pEVar1 = (loop->numIterations).object;
        if (pEVar1 == (Expression *)0x0) {
          throwInternalCompilerError("object != nullptr","operator->",0x3c);
        }
        CompileMessageHelpers::createMessage<>
                  (&local_48,syntax,error,"Number of iterations must be a positive number");
        AST::Context::throwError(&(pEVar1->super_Statement).super_ASTObject.context,&local_48,false)
        ;
      }
    }
    pEVar1 = (loop->numIterations).object;
    if (pEVar1 == (Expression *)0x0) {
      throwInternalCompilerError("object != nullptr","operator->",0x3c);
    }
    local_68 = (Type *)0x800000001;
    local_60 = (uint8_t *)0x0;
    SStack_58.object = (Structure *)0x0;
    expectSilentCastPossible
              (&(pEVar1->super_Statement).super_ASTObject.context,(Type *)&local_68,pEVar1);
    RefCountedPtr<soul::Structure>::decIfNotNull(SStack_58.object);
  }
  return;
}

Assistant:

void visit (AST::LoopStatement& loop) override
        {
            super::visit (loop);

            if (loop.numIterations != nullptr)
            {
                if (auto c = loop.numIterations->getAsConstant())
                    if (c->value.getAsInt64() <= 0)
                        loop.numIterations->context.throwError (Errors::negativeLoopCount());

                expectSilentCastPossible (loop.numIterations->context,
                                          Type (PrimitiveType::int64), *loop.numIterations);
            }
        }